

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdp.cpp
# Opt level: O1

BeliefLowerBound * __thiscall
despot::BeliefMDP::CreateBeliefLowerBound(BeliefMDP *this,string *name)

{
  int iVar1;
  BeliefLowerBound *this_00;
  ostream *poVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 != 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Unsupported belief lower bound: ");
      poVar2 = std::operator<<(poVar2,(string *)name);
      std::endl<char,std::char_traits<char>>(poVar2);
      exit(1);
    }
  }
  this_00 = (BeliefLowerBound *)operator_new(0x10);
  TrivialBeliefLowerBound::TrivialBeliefLowerBound
            ((TrivialBeliefLowerBound *)this_00,&this->super_DSPOMDP);
  return this_00;
}

Assistant:

BeliefLowerBound* BeliefMDP::CreateBeliefLowerBound(string name) const {
	if (name == "TRIVIAL" || name == "DEFAULT") {
		return new TrivialBeliefLowerBound(this);
	} else {
		cerr << "Unsupported belief lower bound: " << name << endl;
		exit(1);
		return NULL;
	}
}